

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC1751.cpp
# Opt level: O2

int jbcoin::RFC1751::wsrch(string *strWord,int iMin,int iMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = -1;
  while ((iVar6 = iMin, iVar5 < 0 && (iMax - iVar6 != 0))) {
    iVar2 = (iMax - iVar6) / 2;
    iVar1 = iVar2 + iVar6;
    iVar3 = std::__cxx11::string::compare((char *)strWord);
    iVar4 = iMax;
    if (iVar3 < 0) {
      iVar4 = iVar1;
    }
    if (iVar3 != 0) {
      iMax = iVar4;
      iVar1 = iVar5;
    }
    iVar5 = iVar1;
    iMin = iVar2 + 1 + iVar6;
    if (iVar3 < 1) {
      iMin = iVar6;
    }
  }
  return iVar5;
}

Assistant:

int RFC1751::wsrch (std::string const& strWord, int iMin, int iMax)
{
    int iResult = -1;

    while (iResult < 0 && iMin != iMax)
    {
        // Have a range to search.
        int iMid    = iMin + (iMax - iMin) / 2;
        int iDir    = strWord.compare (s_dictionary[iMid]);

        if (!iDir)
        {
            iResult = iMid;     // Found it.
        }
        else if (iDir < 0)
        {
            iMax    = iMid;     // key < middle, middle is new max.
        }
        else
        {
            iMin    = iMid + 1; // key > middle, new min is past the middle.
        }
    }

    return iResult;
}